

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
AnalyzeVariableDefinition
          (ExpressionContext *ctx,SynVariableDefinition *syntax,uint alignment,TypeBase *type)

{
  Allocator *allocator;
  ScopeData *scope;
  TypeStruct *pTVar1;
  SynBase *pSVar2;
  VariableData *pVVar3;
  char *pcVar4;
  FunctionData *function;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeFunction *type_00;
  undefined4 extraout_var_02;
  ExprError *pEVar9;
  ExprFunctionAccess *this_00;
  undefined4 extraout_var_03;
  TypeBase *pTVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _func_int **pp_Var11;
  ExprGetAddress *pEVar12;
  ExprBase *pEVar13;
  undefined4 extraout_var_07;
  TypeRef *pTVar14;
  VariableHandle *pVVar15;
  ExprZeroInitialize *this_01;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  char *pcVar16;
  char *in_R8;
  ExprDereference *node;
  ExprGetAddress *pEVar17;
  InplaceStr name;
  InplaceStr name_00;
  FunctionValue bestOverload;
  IntrusiveList<MatchData> aliases;
  VariableData *this;
  undefined4 extraout_var_06;
  undefined4 extraout_var_08;
  
  if (syntax->name == (SynIdentifier *)0x0) {
LAB_0015cc7b:
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              ((ExprError *)CONCAT44(extraout_var_01,iVar7),&syntax->super_SynBase,pTVar10);
    return &((ExprError *)CONCAT44(extraout_var_01,iVar7))->super_ExprBase;
  }
  bestOverload.source = (SynBase *)0x1de694;
  bestOverload.function = (FunctionData *)0x1de698;
  bVar5 = InplaceStr::operator==(&syntax->name->name,(InplaceStr *)&bestOverload);
  if (bVar5) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'this\' is a reserved keyword");
  }
  if ((type != (TypeBase *)0x0) && (type->typeID == 0)) {
    if ((syntax->initializer == (SynBase *)0x0) || (ctx->scope->ownerType != (TypeBase *)0x0))
    goto LAB_0015cc7b;
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar9 = (ExprError *)CONCAT44(extraout_var_04,iVar7);
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    this_00 = (ExprFunctionAccess *)AnalyzeExpression(ctx,syntax->initializer);
    goto LAB_0015cecd;
  }
  name_00 = GetVariableNameInScope(ctx,ctx->scope,syntax->name->name);
  name.end = in_R8;
  name.begin = name_00.end;
  bVar5 = anon_unknown.dwarf_94284::CheckVariableConflict
                    ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
                     (SynBase *)name_00.begin,name);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var,iVar7);
  allocator = ctx->allocator;
  scope = ctx->scope;
  iVar7 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  SynIdentifier::SynIdentifier
            ((SynIdentifier *)CONCAT44(extraout_var_00,iVar7),syntax->name,name_00);
  uVar8 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar8 + 1;
  VariableData::VariableData
            (this,allocator,&syntax->super_SynBase,scope,0,type,
             (SynIdentifier *)CONCAT44(extraout_var_00,iVar7),0,uVar8);
  bVar6 = anon_unknown.dwarf_94284::IsLookupOnlyVariable(ctx,this);
  if (bVar6) {
    this->lookupOnly = true;
  }
  if (!bVar5) {
    ExpressionContext::AddVariable(ctx,this,true);
  }
  if ((syntax->initializer == (SynBase *)0x0) || (this->scope->ownerType != (TypeBase *)0x0)) {
    this_00 = (ExprFunctionAccess *)0x0;
  }
  else {
    this_00 = (ExprFunctionAccess *)AnalyzeExpression(ctx,syntax->initializer);
  }
  if (ctx->typeAuto == type) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar9 = anon_unknown.dwarf_94284::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar10,
                          "ERROR: member variable type cannot be \'auto\'");
      return &pEVar9->super_ExprBase;
    }
    this_00 = (ExprFunctionAccess *)
              ResolveInitializerValue(ctx,&syntax->super_SynBase,&this_00->super_ExprBase);
    type_00 = (TypeFunction *)(this_00->super_ExprBase).type;
    if (type_00 == (TypeFunction *)0x0) {
      type_00 = (TypeFunction *)0x0;
    }
    else if ((type_00->super_TypeBase).typeID == 0) goto LAB_0015ce4e;
  }
  else if (this_00 == (ExprFunctionAccess *)0x0 || type->isGeneric != true) {
    type_00 = (TypeFunction *)type;
    if (type->isGeneric != false) {
      if (this->scope->ownerType != (TypeBase *)0x0) {
        pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar9 = anon_unknown.dwarf_94284::ReportExpected
                           (ctx,&syntax->super_SynBase,pTVar10,
                            "ERROR: member variable type cannot be \'%.*s\'",
                            (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        return &pEVar9->super_ExprBase;
      }
      uVar8 = *(int *)&(type->name).end - (int)(type->name).begin;
      pcVar16 = "ERROR: initializer is required to resolve generic type \'%.*s\'";
      goto LAB_0015d419;
    }
  }
  else {
    pTVar10 = (this_00->super_ExprBase).type;
    if ((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0)) {
LAB_0015ce4e:
      if (!bVar5) {
        DirectChainedMap<IdentifierLookupResult>::remove
                  (&ctx->scope->idLookupMap,(char *)(ulong)this->nameHash);
      }
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar9 = (ExprError *)CONCAT44(extraout_var_03,iVar7);
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
LAB_0015cecd:
      ExprError::ExprError(pEVar9,&syntax->super_SynBase,pTVar10,&this_00->super_ExprBase);
      return &pEVar9->super_ExprBase;
    }
    aliases.head = (MatchData *)0x0;
    aliases.tail = (MatchData *)0x0;
    type_00 = (TypeFunction *)
              MatchGenericType(ctx,&syntax->super_SynBase,type,pTVar10,&aliases,true);
    if ((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).isGeneric == true)) {
      pTVar10 = (this_00->super_ExprBase).type;
      pcVar16 = (pTVar10->name).begin;
      pcVar4 = (type->name).begin;
      anon_unknown.dwarf_94284::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                 (ulong)(uint)(*(int *)&(pTVar10->name).end - (int)pcVar16),pcVar16,
                 (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar4),pcVar4);
    }
    if (((((type_00->super_TypeBase).typeID == 0x15) && (type_00->returnType != (TypeBase *)0x0)) &&
        (type_00->returnType->typeID == 0xe)) &&
       (GetFunctionForType(&bestOverload,ctx,(this_00->super_ExprBase).source,
                           &this_00->super_ExprBase,type_00), function = bestOverload.function,
       bestOverload.function != (FunctionData *)0x0)) {
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this_00 = (ExprFunctionAccess *)CONCAT44(extraout_var_02,iVar7);
      ExprFunctionAccess::ExprFunctionAccess
                (this_00,bestOverload.source,&function->type->super_TypeBase,function,
                 bestOverload.context);
      type_00 = function->type;
    }
  }
  if ((alignment == 0) &&
     (((pTVar10 = ctx->scope->ownerType, pTVar10 == (TypeBase *)0x0 ||
       (alignment = pTVar10->alignment, alignment == 0)) ||
      ((type_00->super_TypeBase).alignment <= alignment)))) {
    alignment = (type_00->super_TypeBase).alignment;
  }
  uVar8 = anon_unknown.dwarf_94284::AllocateVariableInScope
                    (ctx,&syntax->super_SynBase,alignment,&type_00->super_TypeBase);
  this->type = &type_00->super_TypeBase;
  this->alignment = alignment;
  this->offset = uVar8;
  if (((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).typeID != 0x18)) ||
     (*(char *)((long)&type_00[2].super_TypeBase.size + 2) != '\x01')) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_05,iVar7);
      pTVar10 = ctx->typeVoid;
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var11 = (_func_int **)CONCAT44(extraout_var_06,iVar7);
      *pp_Var11 = (_func_int *)syntax->name;
      pp_Var11[1] = (_func_int *)this;
      pp_Var11[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var11 + 3) = 0;
      pEVar13->typeID = 0x1e;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar10;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
      pEVar13[1]._vptr_ExprBase = pp_Var11;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      return pEVar13;
    }
    if (this_00 == (ExprFunctionAccess *)0x0) {
      bVar5 = HasDefaultConstructor(ctx,&syntax->super_SynBase,&type_00->super_TypeBase);
      if (bVar5) {
        pEVar13 = CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
        pTVar10 = this->type;
        pEVar13 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar13);
        this_01 = (ExprZeroInitialize *)
                  CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar10,pEVar13);
      }
      else if (((ctx->scope == ctx->globalScope) ||
               (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) || (this->type->size == 0)) {
        this_01 = (ExprZeroInitialize *)0x0;
      }
      else {
        pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true)
        ;
        if (pEVar12 == (ExprGetAddress *)0x0) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        else {
          uVar8 = (pEVar12->super_ExprBase).typeID;
          if (uVar8 == 0x16) {
            pEVar17 = (ExprGetAddress *)pEVar12->variable;
          }
          else {
            pEVar17 = pEVar12;
            if (uVar8 == 0x22) {
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar17 = (ExprGetAddress *)CONCAT44(extraout_var_11,iVar7);
              pSVar2 = (pEVar12->super_ExprBase).source;
              pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar15 = (VariableHandle *)CONCAT44(extraout_var_12,iVar7);
              pVVar3 = (VariableData *)pEVar12->variable;
              pVVar15->source = (pEVar12->super_ExprBase).source;
              pVVar15->variable = pVVar3;
              pVVar15->next = (VariableHandle *)0x0;
              pVVar15->listed = false;
              ExprGetAddress::ExprGetAddress(pEVar17,pSVar2,&pTVar14->super_TypeBase,pVVar15);
            }
          }
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        this_01 = (ExprZeroInitialize *)CONCAT44(extraout_var_14,iVar7);
        ExprZeroInitialize::ExprZeroInitialize
                  (this_01,syntax->initializer,ctx->typeVoid,&pEVar17->super_ExprBase);
      }
    }
    else {
      pTVar10 = (this_00->super_ExprBase).type;
      if ((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0)) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar13 = (ExprBase *)CONCAT44(extraout_var_09,iVar7);
        pTVar10 = ctx->typeVoid;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var11 = (_func_int **)CONCAT44(extraout_var_10,iVar7);
        *pp_Var11 = (_func_int *)syntax->name;
        pp_Var11[1] = (_func_int *)this;
        pp_Var11[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var11 + 3) = 0;
        pEVar13->typeID = 0x1e;
        pEVar13->source = &syntax->super_SynBase;
        pEVar13->type = pTVar10;
        pEVar13->next = (ExprBase *)0x0;
        pEVar13->listed = false;
        pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
        pEVar13[1]._vptr_ExprBase = pp_Var11;
        *(ExprFunctionAccess **)&pEVar13[1].typeID = this_00;
        return pEVar13;
      }
      pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
      pTVar10 = this->type;
      if ((((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0x13)) ||
          ((pTVar1 = (TypeStruct *)(this_00->super_ExprBase).type, pTVar1 != (TypeStruct *)0x0 &&
           ((pTVar1->super_TypeBase).typeID == 0x13)))) ||
         ((pTVar1 == ctx->typeAutoArray || (pTVar1 == ctx->typeAutoRef)))) {
        this_01 = (ExprZeroInitialize *)
                  CreateAssignment(ctx,syntax->initializer,(ExprBase *)pEVar12,
                                   &this_00->super_ExprBase);
      }
      else {
        pEVar13 = CreateCast(ctx,syntax->initializer,&this_00->super_ExprBase,
                             (TypeBase *)pTVar10[1]._vptr_TypeBase,false);
        if (pEVar12 == (ExprGetAddress *)0x0) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        else {
          uVar8 = (pEVar12->super_ExprBase).typeID;
          if (uVar8 == 0x16) {
            pEVar17 = (ExprGetAddress *)pEVar12->variable;
          }
          else {
            pEVar17 = pEVar12;
            if (uVar8 == 0x22) {
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar17 = (ExprGetAddress *)CONCAT44(extraout_var_07,iVar7);
              pSVar2 = (pEVar12->super_ExprBase).source;
              pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar15 = (VariableHandle *)CONCAT44(extraout_var_08,iVar7);
              pVVar3 = (VariableData *)pEVar12->variable;
              pVVar15->source = (pEVar12->super_ExprBase).source;
              pVVar15->variable = pVVar3;
              pVVar15->next = (VariableHandle *)0x0;
              pVVar15->listed = false;
              ExprGetAddress::ExprGetAddress(pEVar17,pSVar2,&pTVar14->super_TypeBase,pVVar15);
            }
          }
        }
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this_01 = (ExprZeroInitialize *)CONCAT44(extraout_var_13,iVar7);
        pSVar2 = syntax->initializer;
        pTVar10 = ctx->typeVoid;
        (this_01->super_ExprBase).typeID = 0x20;
        (this_01->super_ExprBase).source = pSVar2;
        (this_01->super_ExprBase).type = pTVar10;
        (this_01->super_ExprBase).next = (ExprBase *)0x0;
        (this_01->super_ExprBase).listed = false;
        (this_01->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223fd0;
        this_01->address = &pEVar17->super_ExprBase;
        this_01[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar13;
      }
    }
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_15,iVar7);
    pTVar10 = ctx->typeVoid;
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var11 = (_func_int **)CONCAT44(extraout_var_16,iVar7);
    *pp_Var11 = (_func_int *)syntax->name;
    pp_Var11[1] = (_func_int *)this;
    pp_Var11[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var11 + 3) = 0;
    pEVar13->typeID = 0x1e;
    pEVar13->source = &syntax->super_SynBase;
    pEVar13->type = pTVar10;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
    pEVar13[1]._vptr_ExprBase = pp_Var11;
    *(ExprZeroInitialize **)&pEVar13[1].typeID = this_01;
    return pEVar13;
  }
  uVar8 = *(int *)&(type_00->super_TypeBase).name.end - (int)(type_00->super_TypeBase).name.begin;
  pcVar16 = "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack";
LAB_0015d419:
  anon_unknown.dwarf_94284::Stop(ctx,&syntax->super_SynBase,pcVar16,(ulong)uVar8);
}

Assistant:

ExprBase* AnalyzeVariableDefinition(ExpressionContext &ctx, SynVariableDefinition *syntax, unsigned alignment, TypeBase *type)
{
	if(!syntax->name)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	if(syntax->name->name == InplaceStr("this"))
		Stop(ctx, syntax, "ERROR: 'this' is a reserved keyword");

	if(isType<TypeError>(type))
	{
		if(syntax->initializer && !ctx.scope->ownerType)
			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), AnalyzeExpression(ctx, syntax->initializer));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
	}

	InplaceStr fullName = GetVariableNameInScope(ctx, ctx.scope, syntax->name->name);

	bool conflict = CheckVariableConflict(ctx, syntax, fullName);

	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->name, fullName), 0, ctx.uniqueVariableId++);

	if (IsLookupOnlyVariable(ctx, variable))
		variable->lookupOnly = true;

	if(!conflict)
		ctx.AddVariable(variable, true);

	ExprBase *initializer = syntax->initializer && !variable->scope->ownerType ? AnalyzeExpression(ctx, syntax->initializer) : NULL;

	if(type == ctx.typeAuto)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be 'auto'");

		initializer = ResolveInitializerValue(ctx, syntax, initializer);

		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		type = initializer->type;
	}
	else if(type->isGeneric && initializer)
	{
		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		IntrusiveList<MatchData> aliases;

		TypeBase *match = MatchGenericType(ctx, syntax, type, initializer->type, aliases, true);

		if(!match || match->isGeneric)
			Stop(ctx, syntax, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(initializer->type->name), FMT_ISTR(type->name));

		// If initiallizer is a generic function and the matched function type return type is unknown, we have to instantiate the function here to find the actual return type
		if(TypeFunction *target = getType<TypeFunction>(match))
		{
			if(isType<TypeAuto>(target->returnType))
			{
				if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
				{
					initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);

					match = bestOverload.function->type;
				}
			}
		}

		type = match;
	}
	else if(type->isGeneric)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be '%.*s'", FMT_ISTR(type->name));

		Stop(ctx, syntax, "ERROR: initializer is required to resolve generic type '%.*s'", FMT_ISTR(type->name));
	}

	if(alignment == 0)
	{
		TypeBase *parentType = ctx.scope->ownerType;

		if(parentType && parentType->alignment != 0 && parentType->alignment < type->alignment)
			alignment = parentType->alignment;
		else
			alignment = type->alignment;
	}

	// Fixup variable data not that the final type is known
	unsigned offset = AllocateVariableInScope(ctx, syntax, alignment, type);
	
	variable->type = type;
	variable->alignment = alignment;
	variable->offset = offset;

	if(TypeClass *classType = getType<TypeClass>(variable->type))
	{
		if(classType->hasFinalizer)
			Stop(ctx, syntax, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
	}

	if(variable->scope->ownerType)
		return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), NULL);

	if(initializer)
	{
		if(isType<TypeError>(initializer->type))
			return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);

		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		TypeArray *arrType = getType<TypeArray>(variable->type);

		// Single-level array might be set with a single element at the point of definition
		if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
		{
			initializer = CreateCast(ctx, syntax->initializer, initializer, arrType->subType, false);

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
				access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			else if(ExprDereference *node = getType<ExprDereference>(access))
				access = node->value;

			initializer = new (ctx.get<ExprArraySetup>()) ExprArraySetup(syntax->initializer, ctx.typeVoid, access, initializer);
		}
		else
		{
			initializer = CreateAssignment(ctx, syntax->initializer, access, initializer);
		}
	}
	else if(HasDefaultConstructor(ctx, syntax, variable->type))
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateGetAddress(ctx, syntax, access)))
			initializer = call;
	}
	else if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL && variable->type->size != 0)
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
			access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
		else if(ExprDereference *node = getType<ExprDereference>(access))
			access = node->value;

		initializer = new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(syntax->initializer, ctx.typeVoid, access);
	}

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);
}